

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O3

void slang::ast::SFormat::formatPattern
               (string *result,ConstantValue *arg,Type *type,FormatOptions *options,
               bool isStringLiteral)

{
  char *pcVar1;
  TypeVisitor visitor;
  long *local_260;
  size_type local_258;
  long local_250 [2];
  TypeVisitor local_240;
  
  local_240.abbreviated = options->zeroPad;
  pcVar1 = local_240.buffer.buf.store_;
  local_240.buffer.buf.super_buffer<char>.size_ = 0;
  local_240.buffer.buf.super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_240.buffer.buf.super_buffer<char>.capacity_ = 500;
  local_240.buffer.showColors = false;
  local_240.isStringLiteral = isStringLiteral;
  local_240.buffer.buf.super_buffer<char>.ptr_ = pcVar1;
  Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
            (&type->super_Symbol,&local_240,arg);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,local_240.buffer.buf.super_buffer<char>.ptr_,
             local_240.buffer.buf.super_buffer<char>.ptr_ +
             local_240.buffer.buf.super_buffer<char>.size_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (result,(char *)local_260,local_258);
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  if (local_240.buffer.buf.super_buffer<char>.ptr_ != pcVar1) {
    free(local_240.buffer.buf.super_buffer<char>.ptr_);
  }
  return;
}

Assistant:

void formatPattern(std::string& result, const ConstantValue& arg, const Type& type,
                   const FormatOptions& options, bool isStringLiteral) {
    TypeVisitor visitor(options.zeroPad, isStringLiteral);
    type.visit(visitor, arg);
    result += visitor.buffer.str();
}